

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::xml_document::save
          (xml_document *this,xml_writer *writer,char_t *indent,uint flags,xml_encoding encoding)

{
  bool bVar1;
  ulong in_RCX;
  ulong __n;
  void *__buf;
  xml_buffered_writer *in_RDI;
  int in_R8D;
  xml_buffered_writer buffered_writer;
  xml_writer *in_stack_ffffffffffffd7c8;
  xml_buffered_writer *in_stack_ffffffffffffd7d0;
  uint in_stack_ffffffffffffd7d8;
  uint in_stack_ffffffffffffd7dc;
  char_t *in_stack_ffffffffffffd7e0;
  xml_node_struct *in_stack_ffffffffffffd7e8;
  xml_buffered_writer *in_stack_ffffffffffffd7f0;
  
  __n = in_RCX;
  impl::anon_unknown_0::xml_buffered_writer::xml_buffered_writer
            (in_stack_ffffffffffffd7d0,in_stack_ffffffffffffd7c8,
             (xml_encoding)((ulong)in_RDI >> 0x20));
  if (((in_RCX & 2) != 0) && (in_R8D != 9)) {
    __n = 0xffffffbf;
    impl::anon_unknown_0::xml_buffered_writer::write
              ((xml_buffered_writer *)&stack0xffffffffffffd7c8,-0x11,(void *)0xffffffbb,0xffffffbf);
  }
  if (((in_RCX & 8) == 0) &&
     (bVar1 = impl::anon_unknown_0::has_declaration(*(xml_node_struct **)in_RDI->buffer), !bVar1)) {
    impl::anon_unknown_0::xml_buffered_writer::write_string
              (in_stack_ffffffffffffd7f0,(char_t *)in_stack_ffffffffffffd7e8);
    if (in_R8D == 9) {
      impl::anon_unknown_0::xml_buffered_writer::write_string
                (in_stack_ffffffffffffd7f0,(char_t *)in_stack_ffffffffffffd7e8);
    }
    impl::anon_unknown_0::xml_buffered_writer::write
              ((xml_buffered_writer *)&stack0xffffffffffffd7c8,0x3f,(void *)0x3e,__n);
    if ((in_RCX & 4) == 0) {
      impl::anon_unknown_0::xml_buffered_writer::write
                ((xml_buffered_writer *)&stack0xffffffffffffd7c8,10,__buf,__n);
    }
  }
  impl::anon_unknown_0::node_output
            (in_stack_ffffffffffffd7f0,in_stack_ffffffffffffd7e8,in_stack_ffffffffffffd7e0,
             in_stack_ffffffffffffd7dc,in_stack_ffffffffffffd7d8);
  impl::anon_unknown_0::xml_buffered_writer::flush(in_RDI);
  return;
}

Assistant:

PUGI__FN void xml_document::save(xml_writer& writer, const char_t* indent, unsigned int flags, xml_encoding encoding) const
	{
		impl::xml_buffered_writer buffered_writer(writer, encoding);

		if ((flags & format_write_bom) && encoding != encoding_latin1)
		{
			// BOM always represents the codepoint U+FEFF, so just write it in native encoding
		#ifdef PUGIXML_WCHAR_MODE
			unsigned int bom = 0xfeff;
			buffered_writer.write(static_cast<wchar_t>(bom));
		#else
			buffered_writer.write('\xef', '\xbb', '\xbf');
		#endif
		}

		if (!(flags & format_no_declaration) && !impl::has_declaration(_root))
		{
			buffered_writer.write_string(PUGIXML_TEXT("<?xml version=\"1.0\""));
			if (encoding == encoding_latin1) buffered_writer.write_string(PUGIXML_TEXT(" encoding=\"ISO-8859-1\""));
			buffered_writer.write('?', '>');
			if (!(flags & format_raw)) buffered_writer.write('\n');
		}

		impl::node_output(buffered_writer, _root, indent, flags, 0);

		buffered_writer.flush();
	}